

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ulong in_RAX;
  sas_client *client;
  rxc_sink *sink;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_R9;
  int option_index;
  
  do {
    in_RAX = in_RAX & 0xffffffff;
    iVar1 = getopt_long(argc,argv,"h",long_options,&stack0xffffffffffffffcc,in_R9,in_RAX);
  } while (iVar1 == 0);
  if (iVar1 != -1) {
    if (iVar1 == 0x3f) {
      iVar1 = 1;
    }
    else {
      if (iVar1 != 0x68) {
        abort();
      }
      iVar1 = 0;
    }
    fprintf(_stderr,"usage: %s host file\n",*argv);
    fwrite("\t-h --help\t\tshow a help message\n",0x20,1,_stderr);
    return iVar1;
  }
  if (argc < 3) {
    main_cold_1();
    return 1;
  }
  client = sas_client_alloc();
  if (client == (sas_client *)0x0) {
    sas_log("[ERROR] Failed to allocate server\n");
    return 1;
  }
  sink = sas_drivers_ignore();
  iVar1 = sas_client_init(client,sink);
  if (iVar1 == 0) {
    pcVar2 = argv[1];
    iVar1 = sas_client_connect_hostname(client,pcVar2,0xd80);
    if (iVar1 != 0) {
      pcVar2 = argv[1];
      pcVar3 = gai_strerror(iVar1);
      sas_log("[ERROR] Failed to connect to address %s: %s\n",pcVar2,pcVar3);
      goto LAB_001019fe;
    }
    sas_log("[INFO] Connected to address %s:%d\n",pcVar2,0xd80);
    sas_log("[INFO] Requesting %s\n",argv[2]);
    iVar1 = sas_client_receive(client,argv[2]);
    if (iVar1 == 0) {
      sas_client_dealloc(client);
      return 0;
    }
    pcVar2 = strerror(iVar1);
    pcVar3 = "[ERROR] Failed to receive: %s\n";
  }
  else {
    pcVar2 = strerror(iVar1);
    pcVar3 = "[ERROR] Failed to initialize client: %s\n";
  }
  sas_log(pcVar3,pcVar2);
LAB_001019fe:
  sas_client_dealloc(client);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    /* Parse command line options */
    while (1) {
        int option_index = 0;
        int c = getopt_long(argc, argv, "h", long_options, &option_index);

        if (c == -1) {
            break;
        }

        switch (c) {
            case 0:
                if (long_options[option_index].flag != 0)
                    break;
                break;
            case 'h':
                print_usage(argv[0]);
                return EXIT_SUCCESS;
            case '?':
                print_usage(argv[0]);
                return EXIT_FAILURE;
            default:
                abort();
        }
    }

    if (argc <= 2) {
        print_usage(argv[0]);
        return EXIT_FAILURE;
    }

    int err;
    struct sas_client *client = sas_client_alloc();

    if (!client) {
        sas_log(LOG_ERR "Failed to allocate server\n");
        return EXIT_FAILURE;
    }

    if ((err = sas_client_init(client, sas_drivers_ignore())) != 0) {
        sas_log(LOG_ERR "Failed to initialize client: %s\n", strerror(err));
        sas_client_dealloc(client);
        return EXIT_FAILURE;
    }

    int port = 3456;
    char *addr = argv[1];

    if ((err = sas_client_connect_hostname(client, addr, port)) != 0) {
        sas_log(LOG_ERR "Failed to connect to address %s: %s\n", argv[1], gai_strerror(err));
        sas_client_dealloc(client);
        return EXIT_FAILURE;
    }

    sas_log(LOG_INFO "Connected to address %s:%d\n", addr, port);
    sas_log(LOG_INFO "Requesting %s\n", argv[2]);
    if ((err = sas_client_receive(client, argv[2])) != 0) {
        sas_log(LOG_ERR "Failed to receive: %s\n", strerror(err));
        sas_client_dealloc(client);
        return EXIT_FAILURE;
    }
    sas_client_dealloc(client);

    return EXIT_SUCCESS;
}